

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O2

void ecc_weierstrass_add_prologue
               (WeierstrassPoint *P,WeierstrassPoint *Q,mp_int **Px,mp_int **Py,mp_int **Qx,
               mp_int **denom,mp_int **lambda_n,mp_int **lambda_d)

{
  WeierstrassCurve *pWVar1;
  mp_int *x;
  mp_int *y;
  mp_int *x_00;
  mp_int *y_00;
  mp_int *pmVar2;
  mp_int *pmVar3;
  
  pWVar1 = P->wc;
  x = monty_mul(pWVar1->mc,P->Z,P->Z);
  y = monty_mul(pWVar1->mc,x,P->Z);
  x_00 = monty_mul(pWVar1->mc,Q->Z,Q->Z);
  y_00 = monty_mul(pWVar1->mc,x_00,Q->Z);
  pmVar2 = monty_mul(pWVar1->mc,P->X,x_00);
  *Px = pmVar2;
  pmVar2 = monty_mul(pWVar1->mc,P->Y,y_00);
  *Py = pmVar2;
  pmVar2 = monty_mul(pWVar1->mc,Q->X,x);
  *Qx = pmVar2;
  pmVar2 = monty_mul(pWVar1->mc,Q->Y,y);
  pmVar3 = monty_mul(pWVar1->mc,P->Z,Q->Z);
  *denom = pmVar3;
  pmVar3 = monty_sub(pWVar1->mc,pmVar2,*Py);
  *lambda_n = pmVar3;
  pmVar3 = monty_sub(pWVar1->mc,*Qx,*Px);
  *lambda_d = pmVar3;
  mp_free(x);
  mp_free(y);
  mp_free(x_00);
  mp_free(y_00);
  mp_free(pmVar2);
  return;
}

Assistant:

static inline void ecc_weierstrass_add_prologue(
    WeierstrassPoint *P, WeierstrassPoint *Q,
    mp_int **Px, mp_int **Py, mp_int **Qx, mp_int **denom,
    mp_int **lambda_n, mp_int **lambda_d)
{
    WeierstrassCurve *wc = P->wc;

    /* Powers of the points' denominators */
    mp_int *Pz2 = monty_mul(wc->mc, P->Z, P->Z);
    mp_int *Pz3 = monty_mul(wc->mc, Pz2, P->Z);
    mp_int *Qz2 = monty_mul(wc->mc, Q->Z, Q->Z);
    mp_int *Qz3 = monty_mul(wc->mc, Qz2, Q->Z);

    /* Points' x,y coordinates scaled by the other one's denominator
     * (raised to the appropriate power) */
    *Px = monty_mul(wc->mc, P->X, Qz2);
    *Py = monty_mul(wc->mc, P->Y, Qz3);
    *Qx = monty_mul(wc->mc, Q->X, Pz2);
    mp_int *Qy = monty_mul(wc->mc, Q->Y, Pz3);

    /* Common denominator */
    *denom = monty_mul(wc->mc, P->Z, Q->Z);

    /* Slope of the line through the two points, if P != Q */
    *lambda_n = monty_sub(wc->mc, Qy, *Py);
    *lambda_d = monty_sub(wc->mc, *Qx, *Px);

    mp_free(Pz2);
    mp_free(Pz3);
    mp_free(Qz2);
    mp_free(Qz3);
    mp_free(Qy);
}